

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3WhereEnd(WhereInfo *pWInfo)

{
  byte bVar1;
  u8 uVar2;
  Parse *pParse;
  SrcList *pSVar3;
  sqlite3 *db;
  Vdbe *p;
  WhereLoop *pWVar4;
  int *piVar5;
  Table *pTVar6;
  bool bVar7;
  int iVar8;
  Index *pIVar9;
  anon_union_16_2_dad992c1_for_u *paVar10;
  int iVar11;
  Op *pOVar12;
  WhereLevel *pWVar13;
  int iVar14;
  int op;
  uint uVar15;
  ushort uVar16;
  Index *pIVar17;
  u8 *puVar18;
  ulong uVar19;
  uint uVar20;
  
  pParse = pWInfo->pParse;
  pSVar3 = pWInfo->pTabList;
  db = pParse->db;
  p = pParse->pVdbe;
  sqlite3ExprCacheClear(pParse);
  uVar19 = (ulong)pWInfo->nLevel;
  if (uVar19 != 0) {
    do {
      pWVar13 = pWInfo->a + (uVar19 - 1);
      pWVar4 = pWInfo->a[uVar19 - 1].pWLoop;
      if (pWInfo->a[uVar19 - 1].op == 0xa6) {
        piVar5 = p->pParse->aLabel;
        if (piVar5 != (int *)0x0) {
          piVar5[~(long)pWVar13->addrCont] = p->nOp;
        }
      }
      else {
        iVar8 = 0;
        if (((pWInfo->eDistinct == '\x02') && ((pWVar4->wsFlags & 0x200) != 0)) &&
           (pIVar9 = (pWVar4->u).btree.pIndex, (char)pIVar9->field_0x63 < '\0')) {
          uVar16 = (pWVar4->u).btree.nIdxCol;
          iVar8 = 0;
          if ((uVar16 != 0) && (uVar20 = (uint)uVar16, 0x23 < pIVar9->aiRowLogEst[uVar16])) {
            iVar8 = pParse->nMem + 1;
            uVar15 = 0;
            do {
              sqlite3VdbeAddOp3(p,0x60,pWVar13->iIdxCur,uVar15,iVar8 + uVar15);
              uVar15 = uVar15 + 1;
            } while (uVar20 != uVar15);
            pParse->nMem = pParse->nMem + uVar20 + 1;
            iVar8 = sqlite3VdbeAddOp3(p,(uint)(pWVar13->op != '\x06') * 3 + 0x18,pWVar13->iIdxCur,0,
                                      iVar8);
            if (p->db->mallocFailed == '\0') {
              pOVar12 = p->aOp;
              pOVar12[iVar8].p4type = -3;
              pOVar12[iVar8].p4.i = uVar20;
            }
            sqlite3VdbeAddOp3(p,0xd,1,pWVar13->p2,0);
          }
        }
        piVar5 = p->pParse->aLabel;
        if (piVar5 != (int *)0x0) {
          piVar5[~(long)pWVar13->addrCont] = p->nOp;
        }
        sqlite3VdbeAddOp3(p,(uint)pWVar13->op,pWVar13->p1,pWVar13->p2,(uint)pWVar13->p3);
        iVar14 = p->nOp;
        if (0 < (long)iVar14) {
          p->aOp[(long)iVar14 + -1].p5 = (ushort)pWVar13->p5;
        }
        if (iVar8 != 0) {
          pOVar12 = (Op *)&sqlite3VdbeGetOp_dummy;
          if (p->db->mallocFailed == '\0') {
            iVar11 = iVar14 + -1;
            if (-1 < iVar8) {
              iVar11 = iVar8;
            }
            pOVar12 = p->aOp + iVar11;
          }
          pOVar12->p2 = iVar14;
        }
      }
      if (((pWVar4->wsFlags & 0x800) != 0) && (0 < (pWVar13->u).in.nIn)) {
        piVar5 = p->pParse->aLabel;
        if (piVar5 != (int *)0x0) {
          piVar5[~(long)pWVar13->addrNxt] = p->nOp;
        }
        iVar8 = (pWVar13->u).in.nIn;
        if (0 < (long)iVar8) {
          iVar14 = iVar8 + 1;
          puVar18 = &(pWVar13->u).in.aInLoop[(long)iVar8 + -1].eEndLoopOp;
          do {
            iVar8 = *(int *)(puVar18 + -4);
            pOVar12 = (Op *)&sqlite3VdbeGetOp_dummy;
            if (p->db->mallocFailed == '\0') {
              iVar11 = p->nOp + -1;
              if (-2 < iVar8) {
                iVar11 = iVar8 + 1;
              }
              pOVar12 = p->aOp + iVar11;
            }
            pOVar12->p2 = p->nOp;
            if (*puVar18 != 0xa6) {
              sqlite3VdbeAddOp3(p,(uint)*puVar18,((InLoop *)(puVar18 + -8))->iCur,iVar8,0);
            }
            pOVar12 = (Op *)&sqlite3VdbeGetOp_dummy;
            if (p->db->mallocFailed == '\0') {
              iVar8 = *(int *)(puVar18 + -4);
              if (*(int *)(puVar18 + -4) < 1) {
                iVar8 = p->nOp;
              }
              pOVar12 = p->aOp + (long)iVar8 + -1;
            }
            pOVar12->p2 = p->nOp;
            iVar14 = iVar14 + -1;
            puVar18 = puVar18 + -0xc;
          } while (1 < iVar14);
        }
      }
      piVar5 = p->pParse->aLabel;
      if (piVar5 != (int *)0x0) {
        piVar5[~(long)pWVar13->addrBrk] = p->nOp;
      }
      if (pWVar13->addrSkip != 0) {
        sqlite3VdbeAddOp3(p,0xd,0,pWVar13->addrSkip,0);
        iVar8 = p->nOp;
        if (p->db->mallocFailed == '\0') {
          iVar14 = pWVar13->addrSkip;
          iVar11 = iVar14;
          if (iVar14 < 0) {
            iVar11 = iVar8 + -1;
          }
          p->aOp[iVar11].p2 = iVar8;
          iVar11 = iVar14 + -2;
          if (iVar14 < 2) {
            iVar11 = iVar8 + -1;
          }
          pOVar12 = p->aOp + iVar11;
        }
        else {
          pOVar12 = (Op *)&sqlite3VdbeGetOp_dummy;
          DAT_002b1d88 = iVar8;
        }
        pOVar12->p2 = iVar8;
      }
      if (pWVar13->addrLikeRep != 0) {
        sqlite3VdbeAddOp3(p,0x30,pWVar13->iLikeRepCntr >> 1,pWVar13->addrLikeRep,0);
      }
      if (pWVar13->iLeftJoin != 0) {
        uVar20 = pWVar4->wsFlags;
        iVar8 = sqlite3VdbeAddOp3(p,0x2e,pWVar13->iLeftJoin,0,0);
        if ((uVar20 & 0x40) == 0) {
          sqlite3VdbeAddOp3(p,0x7c,pSVar3->a[uVar19 - 1].iCursor,0,0);
        }
        if (((uVar20 >> 9 & 1) != 0) ||
           (((uVar20 >> 0xd & 1) != 0 && ((pWVar13->u).pCovidx != (Index *)0x0)))) {
          sqlite3VdbeAddOp3(p,0x7c,pWVar13->iIdxCur,0,0);
        }
        if (pWVar13->op == '4') {
          iVar14 = pWVar13->addrFirst;
          iVar11 = pWVar13->p1;
          op = 0xe;
        }
        else {
          iVar14 = pWVar13->addrFirst;
          op = 0xd;
          iVar11 = 0;
        }
        sqlite3VdbeAddOp3(p,op,iVar11,iVar14,0);
        pOVar12 = (Op *)&sqlite3VdbeGetOp_dummy;
        if (p->db->mallocFailed == '\0') {
          iVar14 = p->nOp + -1;
          if (-1 < iVar8) {
            iVar14 = iVar8;
          }
          pOVar12 = p->aOp + iVar14;
        }
        pOVar12->p2 = p->nOp;
      }
      bVar7 = 1 < (long)uVar19;
      uVar19 = uVar19 - 1;
    } while (bVar7);
  }
  piVar5 = p->pParse->aLabel;
  if (piVar5 != (int *)0x0) {
    piVar5[~(long)pWInfo->iBreak] = p->nOp;
  }
  if (pWInfo->nLevel != '\0') {
    pWVar13 = pWInfo->a;
    uVar20 = 0;
    do {
      bVar1 = pWVar13->iFrom;
      if ((pSVar3->a[bVar1].fg.field_0x1 & 0x10) == 0) {
        uVar15 = pWVar13->pWLoop->wsFlags;
        if ((uVar15 & 0x240) == 0) {
          if ((uVar15 >> 0xd & 1) != 0) {
            paVar10 = &pWVar13->u;
            goto LAB_00243763;
          }
          pIVar9 = (Index *)0x0;
        }
        else {
          paVar10 = (anon_union_16_2_dad992c1_for_u *)&(pWVar13->pWLoop->u).btree.pIndex;
LAB_00243763:
          pIVar9 = paVar10->pCovidx;
        }
        if ((pIVar9 != (Index *)0x0) &&
           (((pTVar6 = pSVar3->a[bVar1].pTab, pWInfo->eOnePass == '\0' ||
             ((pIVar9->pTable->tabFlags & 0x20) != 0)) && (db->mallocFailed == '\0')))) {
          iVar8 = p->nOp;
          iVar14 = pWVar13->addrBody;
          pOVar12 = (Op *)&sqlite3VdbeGetOp_dummy;
          if (p->db->mallocFailed == '\0') {
            iVar11 = iVar8 + -1;
            if (-1 < iVar14) {
              iVar11 = iVar14;
            }
            pOVar12 = p->aOp + iVar11;
          }
          if (iVar14 < iVar8) {
            iVar11 = pWVar13->iTabCur;
            do {
              if (pOVar12->p1 == iVar11) {
                uVar2 = pOVar12->opcode;
                if (uVar2 == '\x17') {
LAB_0024387e:
                  pOVar12->p1 = pWVar13->iIdxCur;
                }
                else if (uVar2 == '{') {
                  pOVar12->p1 = pWVar13->iIdxCur;
                  pOVar12->opcode = 0x81;
                }
                else if (uVar2 == '`') {
                  uVar15 = pOVar12->p2;
                  if ((pTVar6->tabFlags & 0x20) != 0) {
                    for (pIVar17 = pTVar6->pIndex;
                        (pIVar17 != (Index *)0x0 && ((pIVar17->field_0x63 & 3) != 2));
                        pIVar17 = pIVar17->pNext) {
                    }
                    uVar15 = (uint)(ushort)pIVar17->aiColumn[(int)uVar15];
                  }
                  uVar16 = 0xffff;
                  if ((ulong)pIVar9->nColumn != 0) {
                    uVar19 = 0;
                    do {
                      if (pIVar9->aiColumn[uVar19] == (short)uVar15) {
                        uVar16 = (ushort)uVar19;
                        break;
                      }
                      uVar19 = uVar19 + 1;
                      uVar16 = 0xffff;
                    } while (pIVar9->nColumn != uVar19);
                  }
                  if (-1 < (short)uVar16) {
                    pOVar12->p2 = (uint)uVar16;
                    goto LAB_0024387e;
                  }
                }
              }
              iVar14 = iVar14 + 1;
              pOVar12 = pOVar12 + 1;
            } while (iVar14 != iVar8);
          }
        }
      }
      else {
        translateColumnToCopy
                  (pParse,pWVar13->addrBody,pWVar13->iTabCur,pSVar3->a[bVar1].regResult,0);
      }
      uVar20 = uVar20 + 1;
      pWVar13 = pWVar13 + 1;
    } while (uVar20 < pWInfo->nLevel);
  }
  pParse->nQueryLoop = pWInfo->savedNQueryLoop;
  whereInfoFree(db,pWInfo);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3WhereEnd(WhereInfo *pWInfo){
  Parse *pParse = pWInfo->pParse;
  Vdbe *v = pParse->pVdbe;
  int i;
  WhereLevel *pLevel;
  WhereLoop *pLoop;
  SrcList *pTabList = pWInfo->pTabList;
  sqlite3 *db = pParse->db;

  /* Generate loop termination code.
  */
  VdbeModuleComment((v, "End WHERE-core"));
  sqlite3ExprCacheClear(pParse);
  for(i=pWInfo->nLevel-1; i>=0; i--){
    int addr;
    pLevel = &pWInfo->a[i];
    pLoop = pLevel->pWLoop;
    if( pLevel->op!=OP_Noop ){
#ifndef SQLITE_DISABLE_SKIPAHEAD_DISTINCT
      int addrSeek = 0;
      Index *pIdx;
      int n;
      if( pWInfo->eDistinct==WHERE_DISTINCT_ORDERED
       && (pLoop->wsFlags & WHERE_INDEXED)!=0
       && (pIdx = pLoop->u.btree.pIndex)->hasStat1
       && (n = pLoop->u.btree.nIdxCol)>0
       && pIdx->aiRowLogEst[n]>=36
      ){
        int r1 = pParse->nMem+1;
        int j, op;
        for(j=0; j<n; j++){
          sqlite3VdbeAddOp3(v, OP_Column, pLevel->iIdxCur, j, r1+j);
        }
        pParse->nMem += n+1;
        op = pLevel->op==OP_Prev ? OP_SeekLT : OP_SeekGT;
        addrSeek = sqlite3VdbeAddOp4Int(v, op, pLevel->iIdxCur, 0, r1, n);
        VdbeCoverageIf(v, op==OP_SeekLT);
        VdbeCoverageIf(v, op==OP_SeekGT);
        sqlite3VdbeAddOp2(v, OP_Goto, 1, pLevel->p2);
      }
#endif /* SQLITE_DISABLE_SKIPAHEAD_DISTINCT */
      /* The common case: Advance to the next row */
      sqlite3VdbeResolveLabel(v, pLevel->addrCont);
      sqlite3VdbeAddOp3(v, pLevel->op, pLevel->p1, pLevel->p2, pLevel->p3);
      sqlite3VdbeChangeP5(v, pLevel->p5);
      VdbeCoverage(v);
      VdbeCoverageIf(v, pLevel->op==OP_Next);
      VdbeCoverageIf(v, pLevel->op==OP_Prev);
      VdbeCoverageIf(v, pLevel->op==OP_VNext);
#ifndef SQLITE_DISABLE_SKIPAHEAD_DISTINCT
      if( addrSeek ) sqlite3VdbeJumpHere(v, addrSeek);
#endif
    }else{
      sqlite3VdbeResolveLabel(v, pLevel->addrCont);
    }
    if( pLoop->wsFlags & WHERE_IN_ABLE && pLevel->u.in.nIn>0 ){
      struct InLoop *pIn;
      int j;
      sqlite3VdbeResolveLabel(v, pLevel->addrNxt);
      for(j=pLevel->u.in.nIn, pIn=&pLevel->u.in.aInLoop[j-1]; j>0; j--, pIn--){
        sqlite3VdbeJumpHere(v, pIn->addrInTop+1);
        if( pIn->eEndLoopOp!=OP_Noop ){
          sqlite3VdbeAddOp2(v, pIn->eEndLoopOp, pIn->iCur, pIn->addrInTop);
          VdbeCoverage(v);
          VdbeCoverageIf(v, pIn->eEndLoopOp==OP_PrevIfOpen);
          VdbeCoverageIf(v, pIn->eEndLoopOp==OP_NextIfOpen);
        }
        sqlite3VdbeJumpHere(v, pIn->addrInTop-1);
      }
    }
    sqlite3VdbeResolveLabel(v, pLevel->addrBrk);
    if( pLevel->addrSkip ){
      sqlite3VdbeGoto(v, pLevel->addrSkip);
      VdbeComment((v, "next skip-scan on %s", pLoop->u.btree.pIndex->zName));
      sqlite3VdbeJumpHere(v, pLevel->addrSkip);
      sqlite3VdbeJumpHere(v, pLevel->addrSkip-2);
    }
#ifndef SQLITE_LIKE_DOESNT_MATCH_BLOBS
    if( pLevel->addrLikeRep ){
      sqlite3VdbeAddOp2(v, OP_DecrJumpZero, (int)(pLevel->iLikeRepCntr>>1),
                        pLevel->addrLikeRep);
      VdbeCoverage(v);
    }
#endif
    if( pLevel->iLeftJoin ){
      int ws = pLoop->wsFlags;
      addr = sqlite3VdbeAddOp1(v, OP_IfPos, pLevel->iLeftJoin); VdbeCoverage(v);
      assert( (ws & WHERE_IDX_ONLY)==0 || (ws & WHERE_INDEXED)!=0 );
      if( (ws & WHERE_IDX_ONLY)==0 ){
        sqlite3VdbeAddOp1(v, OP_NullRow, pTabList->a[i].iCursor);
      }
      if( (ws & WHERE_INDEXED) 
       || ((ws & WHERE_MULTI_OR) && pLevel->u.pCovidx) 
      ){
        sqlite3VdbeAddOp1(v, OP_NullRow, pLevel->iIdxCur);
      }
      if( pLevel->op==OP_Return ){
        sqlite3VdbeAddOp2(v, OP_Gosub, pLevel->p1, pLevel->addrFirst);
      }else{
        sqlite3VdbeGoto(v, pLevel->addrFirst);
      }
      sqlite3VdbeJumpHere(v, addr);
    }
    VdbeModuleComment((v, "End WHERE-loop%d: %s", i,
                     pWInfo->pTabList->a[pLevel->iFrom].pTab->zName));
  }

  /* The "break" point is here, just past the end of the outer loop.
  ** Set it.
  */
  sqlite3VdbeResolveLabel(v, pWInfo->iBreak);

  assert( pWInfo->nLevel<=pTabList->nSrc );
  for(i=0, pLevel=pWInfo->a; i<pWInfo->nLevel; i++, pLevel++){
    int k, last;
    VdbeOp *pOp;
    Index *pIdx = 0;
    struct SrcList_item *pTabItem = &pTabList->a[pLevel->iFrom];
    Table *pTab = pTabItem->pTab;
    assert( pTab!=0 );
    pLoop = pLevel->pWLoop;

    /* For a co-routine, change all OP_Column references to the table of
    ** the co-routine into OP_Copy of result contained in a register.
    ** OP_Rowid becomes OP_Null.
    */
    if( pTabItem->fg.viaCoroutine ){
      testcase( pParse->db->mallocFailed );
      translateColumnToCopy(pParse, pLevel->addrBody, pLevel->iTabCur,
                            pTabItem->regResult, 0);
      continue;
    }

    /* If this scan uses an index, make VDBE code substitutions to read data
    ** from the index instead of from the table where possible.  In some cases
    ** this optimization prevents the table from ever being read, which can
    ** yield a significant performance boost.
    ** 
    ** Calls to the code generator in between sqlite3WhereBegin and
    ** sqlite3WhereEnd will have created code that references the table
    ** directly.  This loop scans all that code looking for opcodes
    ** that reference the table and converts them into opcodes that
    ** reference the index.
    */
    if( pLoop->wsFlags & (WHERE_INDEXED|WHERE_IDX_ONLY) ){
      pIdx = pLoop->u.btree.pIndex;
    }else if( pLoop->wsFlags & WHERE_MULTI_OR ){
      pIdx = pLevel->u.pCovidx;
    }
    if( pIdx
     && (pWInfo->eOnePass==ONEPASS_OFF || !HasRowid(pIdx->pTable))
     && !db->mallocFailed
    ){
      last = sqlite3VdbeCurrentAddr(v);
      k = pLevel->addrBody;
      pOp = sqlite3VdbeGetOp(v, k);
      for(; k<last; k++, pOp++){
        if( pOp->p1!=pLevel->iTabCur ) continue;
        if( pOp->opcode==OP_Column ){
          int x = pOp->p2;
          assert( pIdx->pTable==pTab );
          if( !HasRowid(pTab) ){
            Index *pPk = sqlite3PrimaryKeyIndex(pTab);
            x = pPk->aiColumn[x];
            assert( x>=0 );
          }
          x = sqlite3ColumnOfIndex(pIdx, x);
          if( x>=0 ){
            pOp->p2 = x;
            pOp->p1 = pLevel->iIdxCur;
          }
          assert( (pLoop->wsFlags & WHERE_IDX_ONLY)==0 || x>=0 
              || pWInfo->eOnePass );
        }else if( pOp->opcode==OP_Rowid ){
          pOp->p1 = pLevel->iIdxCur;
          pOp->opcode = OP_IdxRowid;
        }else if( pOp->opcode==OP_IfNullRow ){
          pOp->p1 = pLevel->iIdxCur;
        }
      }
    }
  }

  /* Final cleanup
  */
  pParse->nQueryLoop = pWInfo->savedNQueryLoop;
  whereInfoFree(db, pWInfo);
  return;
}